

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O3

void parasail_sequences_free(parasail_sequences_t *sequences)

{
  void *pvVar1;
  parasail_sequence_t *ppVar2;
  long lVar3;
  ulong uVar4;
  
  if (sequences->l != 0) {
    lVar3 = 0;
    uVar4 = 0;
    do {
      ppVar2 = sequences->seqs;
      pvVar1 = *(void **)((long)&(ppVar2->name).s + lVar3);
      if (pvVar1 != (void *)0x0) {
        free(pvVar1);
        ppVar2 = sequences->seqs;
      }
      pvVar1 = *(void **)((long)&(ppVar2->comment).s + lVar3);
      if (pvVar1 != (void *)0x0) {
        free(pvVar1);
        ppVar2 = sequences->seqs;
      }
      pvVar1 = *(void **)((long)&(ppVar2->seq).s + lVar3);
      if (pvVar1 != (void *)0x0) {
        free(pvVar1);
        ppVar2 = sequences->seqs;
      }
      pvVar1 = *(void **)((long)&(ppVar2->qual).s + lVar3);
      if (pvVar1 != (void *)0x0) {
        free(pvVar1);
      }
      uVar4 = uVar4 + 1;
      lVar3 = lVar3 + 0x40;
    } while (uVar4 < sequences->l);
  }
  free(sequences->seqs);
  free(sequences);
  return;
}

Assistant:

void parasail_sequences_free(parasail_sequences_t *sequences)
{
    size_t i;
    for (i=0; i<sequences->l; ++i) {
        if (sequences->seqs[i].name.s)    free(sequences->seqs[i].name.s);
        if (sequences->seqs[i].comment.s) free(sequences->seqs[i].comment.s);
        if (sequences->seqs[i].seq.s)     free(sequences->seqs[i].seq.s);
        if (sequences->seqs[i].qual.s)    free(sequences->seqs[i].qual.s);
    }
    free(sequences->seqs);
    free(sequences);
}